

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2obs.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  double dVar3;
  CESkyCoord obs_coords;
  CESkyCoord obs_icrs_coords;
  CEDate date;
  CESkyCoord icrs_coords;
  CEObserver observer;
  CEExecOptions opts;
  string local_420;
  double local_3f0;
  double local_3e8;
  string local_3e0;
  CEAngleType local_3ac;
  string local_3a8;
  string local_388 [2];
  double local_348;
  CESkyCoord local_340 [48];
  string local_310;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  CEExecOptions local_260;
  
  DefineOpts();
  bVar2 = CLOptions::ParseCommandLine(&local_260.super_CLOptions,argc,argv);
  if (!bVar2) {
    paVar1 = &local_310.field_2;
    local_310._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"ra","");
    local_3a8._M_dataplus._M_p = (pointer)CLOptions::AsDouble(&local_260.super_CLOptions,&local_310)
    ;
    CEAngle::Deg((double *)&local_420);
    local_388[0]._M_dataplus._M_p = (pointer)&local_388[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"dec","");
    local_3e8 = CLOptions::AsDouble(&local_260.super_CLOptions,local_388);
    CEAngle::Deg((double *)&local_3e0);
    local_3f0 = (double)CONCAT44(local_3f0._4_4_,1);
    CESkyCoord::CESkyCoord
              (local_340,(CEAngle *)&local_420,(CEAngle *)&local_3e0,(CESkyCoordType *)&local_3f0);
    CEAngle::~CEAngle((CEAngle *)&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388[0]._M_dataplus._M_p != &local_388[0].field_2) {
      operator_delete(local_388[0]._M_dataplus._M_p);
    }
    CEAngle::~CEAngle((CEAngle *)&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar1) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    local_310._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"juliandate","");
    dVar3 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_310);
    CEDate::CEDate((CEDate *)local_388,dVar3,JD);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar1) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    paVar1 = &local_420.field_2;
    local_420._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"longitude","");
    local_3e8 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_420);
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"latitude","");
    local_3f0 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_3e0);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"elevation","");
    local_348 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_3a8);
    local_3ac = DEGREES;
    CEObserver::CEObserver((CEObserver *)&local_310,&local_3e8,&local_3f0,&local_348,&local_3ac);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != paVar1) {
      operator_delete(local_420._M_dataplus._M_p);
    }
    local_420._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"pressure","");
    local_2f0 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != paVar1) {
      operator_delete(local_420._M_dataplus._M_p);
    }
    local_420._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"temperature","");
    local_2e8 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != paVar1) {
      operator_delete(local_420._M_dataplus._M_p);
    }
    local_420._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"humidity","");
    local_2e0 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != paVar1) {
      operator_delete(local_420._M_dataplus._M_p);
    }
    local_420._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"wavelength","");
    local_2d8 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != paVar1) {
      operator_delete(local_420._M_dataplus._M_p);
    }
    CESkyCoord::CESkyCoord((CESkyCoord *)&local_420);
    CESkyCoord::CESkyCoord((CESkyCoord *)&local_3e0);
    CESkyCoord::ICRS2Observed
              (local_340,(CESkyCoord *)&local_420,(CEDate *)local_388,(CEObserver *)&local_310,
               (CESkyCoord *)&local_3e0,(CEAngle *)0x0);
    PrintResults(local_340,(CESkyCoord *)&local_420,(CESkyCoord *)&local_3e0,
                 (CEObserver *)&local_310,(CEDate *)local_388);
    CESkyCoord::~CESkyCoord((CESkyCoord *)&local_3e0);
    CESkyCoord::~CESkyCoord((CESkyCoord *)&local_420);
    CEObserver::~CEObserver((CEObserver *)&local_310);
    CEDate::~CEDate((CEDate *)local_388);
    CESkyCoord::~CESkyCoord(local_340);
  }
  CEExecOptions::~CEExecOptions(&local_260);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{    
    CEExecOptions opts = DefineOpts();
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Create the input and output coordinates
    CESkyCoord icrs_coords(CEAngle::Deg(opts.AsDouble("ra")), 
                           CEAngle::Deg(opts.AsDouble("dec")),
                           CESkyCoordType::ICRS);
    
    // Define the date
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);

    // Define the observer
    CEObserver observer(opts.AsDouble("longitude"),
                        opts.AsDouble("latitude"),
                        opts.AsDouble("elevation"),
                        CEAngleType::DEGREES);
    observer.SetPressure_hPa(opts.AsDouble("pressure"));
    observer.SetTemperature_C(opts.AsDouble("temperature"));
    observer.SetRelativeHumidity(opts.AsDouble("humidity"));
    observer.SetWavelength_um(opts.AsDouble("wavelength"));

    // Convert the coordinates
    CESkyCoord obs_coords;
    CESkyCoord obs_icrs_coords;
    CESkyCoord::ICRS2Observed(icrs_coords, &obs_coords, date, observer, &obs_icrs_coords);
    
    // Print the results
    PrintResults(icrs_coords, obs_coords, obs_icrs_coords, observer, date);
    
    return 0 ;
}